

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>_>
  *__r;
  anon_struct_40_9_5a18a00c_for__M_head_impl *this_00;
  anon_struct_8_2_7f46c34e_for__M_head_impl *in_RDI;
  anon_struct_40_9_5a18a00c_for__M_head_impl *unaff_retaddr;
  CodecFactory **in_stack_00000008;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_stack_00000020;
  int *in_stack_fffffffffffffff0;
  
  bVar1 = AtEnd(in_stack_00000020);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                *)0x92ba4e);
    __r = (shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>_>
           *)ParamIterator<const_libaom_test::CodecFactory_*>::operator*
                       ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x92ba56);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                *)0x92ba68);
    this_00 = ParamIterator<(anonymous_namespace)::TestVideoParam>::operator*
                        ((ParamIterator<(anonymous_namespace)::TestVideoParam> *)0x92ba70);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                *)0x92ba83);
    ParamIterator<(anonymous_namespace)::TestEncodeParam>::operator*
              ((ParamIterator<(anonymous_namespace)::TestEncodeParam> *)0x92ba8b);
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                *)0x92ba9e);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x92baa6);
    std::
    make_shared<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,(anonymous_namespace)::TestEncodeParam,int>,libaom_test::CodecFactory_const*const&,(anonymous_namespace)::TestVideoParam_const&,(anonymous_namespace)::TestEncodeParam_const&,int_const&>
              (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    std::
    shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>_>
    ::operator=((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>_>
                 *)this_00,__r);
    std::
    shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>_>
    ::~shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>_>
                   *)0x92bade);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }